

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,AssertionResult *ar,char *expr,char *actual
          ,char *expected)

{
  bool bVar1;
  char *pcVar2;
  allocator<char> local_32;
  undefined1 local_31;
  char *local_30;
  char *expected_local;
  char *actual_local;
  char *expr_local;
  AssertionResult *ar_local;
  string *str;
  
  local_31 = 0;
  local_30 = actual;
  expected_local = expr;
  actual_local = (char *)ar;
  expr_local = (char *)this;
  ar_local = (AssertionResult *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"error: Value of: ",&local_32);
  std::allocator<char>::~allocator(&local_32);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,actual_local);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n  Actual: ");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,expected_local);
  pcVar2 = AssertionResult::message((AssertionResult *)expr_local);
  bVar1 = detail::IsEmpty(pcVar2);
  if (!bVar1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," (");
    pcVar2 = AssertionResult::message((AssertionResult *)expr_local);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar2);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\nExpected: ");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_30);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string GetBooleanAssertionFailureMessage(const AssertionResult& ar
    , const char* expr, const char* actual, const char* expected)
{
    ::std::string str = "error: Value of: ";
    str += expr;
    str += "\n  Actual: ";
    str += actual;
    if( !detail::IsEmpty(ar.message()) )
    {
        str += " (";
        str += ar.message();
        str += ")";
    }
    str += "\nExpected: ";
    str += expected;
    return str;
}